

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_bauth.c
# Opt level: O1

err_t btokBAuthCTStep4(octet *out,octet *in,void *state)

{
  octet *header;
  u64 *dest;
  long lVar1;
  ulong m;
  ulong count;
  bool_t bVar2;
  octet *key_;
  word wVar3;
  word *c;
  ulong n;
  size_t sVar4;
  word *state_00;
  err_t eVar5;
  octet *level;
  ulong count_00;
  
  bVar2 = objIsOperable(state);
  eVar5 = 0x6d;
  if (bVar2 != 0) {
    lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
    m = *(ulong *)(lVar1 + 0x30);
    count = *(ulong *)(lVar1 + 0x38);
    count_00 = count >> 1;
    sVar4 = 0;
    if (*(int *)((long)state + 0x194) != -8) {
      sVar4 = count_00;
    }
    bVar2 = memIsValid(in,sVar4);
    if (bVar2 != 0) {
      if (*(int *)((long)state + 0x194) == 0) {
        sVar4 = 0;
      }
      else {
        sVar4 = *(long *)((long)state + 0x1d0) + count + 8;
      }
      bVar2 = memIsValid(out,sVar4);
      if (bVar2 != 0) {
        lVar1 = *state;
        header = (octet *)((long)state + lVar1);
        n = m >> 1;
        c = (word *)(header + n * 8 + 0x30);
        state_00 = c + m + n + 5;
        beltHashStart(state_00);
        beltHashStepH(*(void **)((long)state + 0x38),count_00,state_00);
        if (*(int *)((long)state + 0x194) != 0) {
          beltHashStepH(in + 8,count_00,state_00);
        }
        if (*(void **)((long)state + 0x198) != (void *)0x0) {
          beltHashStepH(*(void **)((long)state + 0x198),*(size_t *)((long)state + 0x1a0),state_00);
        }
        key_ = (octet *)((long)state + lVar1 + 0x10);
        dest = (u64 *)((long)state + lVar1 + 0x30);
        level = (octet *)((long)state + lVar1 + 0x50);
        if (*(void **)((long)state + 0x1a8) != (void *)0x0) {
          beltHashStepH(*(void **)((long)state + 0x1a8),*(size_t *)((long)state + 0x1b0),state_00);
        }
        beltHashStepG((octet *)dest,state_00);
        memSet(header,'\0',0x10);
        memSet(level,0xff,0x10);
        beltKRPStart(state_00,(octet *)dest,0x20,level);
        beltKRPStepG((octet *)((long)state + 0x1e0),0x20,header,state_00);
        *header = '\x01';
        beltKRPStepG(key_,0x20,header,state_00);
        if (*(int *)((long)state + 0x194) != 0) {
          *header = '\x02';
          beltKRPStepG((octet *)(c + m + n + 1),0x20,header,state_00);
        }
        *header = '\0';
        beltMACStart(state_00,key_,0x20);
        beltMACStepA(header,0x10,state_00);
        bVar2 = beltMACStepV(in,state_00);
        if (bVar2 == 0) {
          eVar5 = 0x209;
        }
        else {
          eVar5 = 0;
          if (*(int *)((long)state + 0x194) != 0) {
            beltHashStart(state_00);
            beltHashStepH(*(void **)((long)state + 0x30),count,state_00);
            beltHashStepH(in + 8,0x10,state_00);
            beltHashStepG2((octet *)dest,count_00,state_00);
            u64From(dest,dest,count_00);
            zzMul(c,dest,n,*(word **)((long)state + 0x20),m,state_00);
            wVar3 = zzAdd2(c + n,*(word **)((long)state + 0x20),m);
            c[n + m] = wVar3;
            zzMod(c,c,n + m + 1,*(word **)(*(long *)((long)state + 0x18) + 0x38),m,state_00);
            zzSubMod(c,*(word **)((long)state + 0x28),c,
                     *(word **)(*(long *)((long)state + 0x18) + 0x38),m);
            u64To(out,count,c);
            memCopy(out + count,*(void **)((long)state + 0x1c8),*(size_t *)((long)state + 0x1d0));
            *header = '\0';
            beltCFBStart(state_00,(octet *)(c + m + n + 1),0x20,header);
            beltCFBStepE(out,*(long *)((long)state + 0x1d0) + count,state_00);
            beltMACStart(state_00,key_,0x20);
            beltMACStepA(out,count + *(long *)((long)state + 0x1d0),state_00);
            beltMACStepG(out + count + *(long *)((long)state + 0x1d0),state_00);
            eVar5 = 0;
          }
        }
      }
    }
  }
  return eVar5;
}

Assistant:

err_t btokBAuthCTStep4(octet out[], const octet in[], void* state)
{
	bake_bauth_ct_o* s = (bake_bauth_ct_o*)state;
	size_t n, no;
	// стек
	octet* Y;		/* [32] (совпадает c t, sct) */
	octet* block0;	/* [16] (следует перед Y) */
	octet* block1;	/* [16] (следует за Y) */
	octet* K1;		/* [32] общий ключ (совпадает с Y) */
	octet* K2;		/* [32] общий ключ */
	word* t;		/* [n / 2 + 1] (совпадает c Y, sct) */
	word* sct;		/* [n + n / 2 + 1] (совпадает c Y, t) */
	void* stack;
	// проверить входные данные
	if (!objIsOperable(s))
		return ERR_BAD_INPUT;
	n = s->ec->f->n, no = s->ec->f->no;
	if (!memIsValid(in, 8u + s->settings->kcb ? no / 2 : 0) ||
		!memIsValid(out, s->settings->kcb ? (8u + no + s->cert->len) : 0))
		return ERR_BAD_INPUT;
	ASSERT(memIsDisjoint2(out, s->settings->kcb ?
		(8u + O_OF_B(2 * s->params->l) + s->cert->len) : 0, s, objKeep(s)));
	block0 = objEnd(s, octet);
	K1 = block0 + 16;
	Y = K1 + 32;
	t = (word*)Y;
	sct = t + n / 2;
	block1 = Y + 32;
	K2 = (octet*)(sct + n + n / 2 + 1);
	stack = K2 + 32;
	// Y <- beltHash(<Rct>_l || [<Rt>_l ||] helloa || hellob)
	beltHashStart(stack);
	beltHashStepH(s->R, no / 2, stack);
	if (s->settings->kcb)
  	beltHashStepH(in + 8, no / 2, stack);
	if (s->settings->helloa)
		beltHashStepH(s->settings->helloa, s->settings->helloa_len, stack);
	if (s->settings->hellob)
		beltHashStepH(s->settings->hellob, s->settings->hellob_len, stack);
	ASSERT(no >= 32);
	beltHashStepG(Y, stack);
	// K0 <- beltKRP(Y, 1^96, 0)
	memSetZero(block0, 16);
	memSet(block1, 0xFF, 16);
	beltKRPStart(stack, Y, 32, block1);
	beltKRPStepG(s->K0, 32, block0, stack);
	// K1 <- beltKRP(Y, 1^96, 1)
	block0[0] = 1;
	beltKRPStepG(K1, 32, block0, stack);
	// K2 <- beltKRP(Y, 1^96, 2)
	if (s->settings->kcb)
	{
		block0[0] = 2;
		beltKRPStepG(K2, 32, block0, stack);
	}
	// Tt == beltMAC(0^128, K1)?
	block0[0] = 0;
	beltMACStart(stack, K1, 32);
	beltMACStepA(block0, 16, stack);
	if (!beltMACStepV(in, stack))
		return ERR_AUTH;
	if (s->settings->kcb)
	{
		// t <- <beltHash(<Vct>_2l || Rt)>_l
		beltHashStart(stack);
		beltHashStepH(s->V, no, stack);
		beltHashStepH(in + 8, 16, stack);
		beltHashStepG2((octet*)t, no / 2, stack);
		wwFrom(t, t, no / 2);
		// sct <- (uct - (2^l + t)dct) \mod q
		zzMul(sct, t, n / 2, s->d, n, stack);
		sct[n + n / 2] = zzAdd2(sct + n / 2, s->d, n);
		zzMod(sct, sct, n + n / 2 + 1, s->ec->order, n, stack);
		zzSubMod(sct, s->u, sct, s->ec->order, n);
  		// out ||.. <- sct || cert_ct
		wwTo(out, no, sct);
		memCopy(out + no, s->cert->data, s->cert->len);
		// out ||.. <- beltCFBEncr(sct || cert_ct, K2, 0^128)
		block0[0] = 0;
		beltCFBStart(stack, K2, 32, block0);
		beltCFBStepE(out, no + s->cert->len, stack);
		// ..|| out <- beltMAC(beltCFBEncr(sct || cert_ct))
		beltMACStart(stack, K1, 32);
		beltMACStepA(out, no + s->cert->len, stack);
		beltMACStepG(out + no + s->cert->len, stack);
	}
	// все нормально
	return ERR_OK;
}